

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

monst * clone_mon(monst *mon,xchar x,xchar y)

{
  xchar x_00;
  xchar y_00;
  schar sVar1;
  level *lev;
  uint uVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  monst *pmVar6;
  int local_5c;
  int local_54;
  uint local_44;
  monst *m3;
  monst *m2;
  coord mm;
  xchar y_local;
  monst *pmStack_18;
  xchar x_local;
  monst *mon_local;
  
  if ((mon->mhp < 2) ||
     (m2._6_1_ = y, m2._7_1_ = x, pmStack_18 = mon, iVar4 = monsndx(mon->data),
     (mvitals[iVar4].mvflags & 1) != 0)) {
    return (monst *)0x0;
  }
  if (m2._7_1_ == '\0') {
    m2._4_1_ = pmStack_18->mx;
    m2._5_1_ = pmStack_18->my;
    bVar3 = enexto((coord *)((long)&m2 + 4),level,m2._4_1_,m2._5_1_,pmStack_18->data);
    if ((bVar3 == '\0') ||
       ((level->monsters[m2._4_1_][m2._5_1_] != (monst *)0x0 &&
        ((*(uint *)&level->monsters[m2._4_1_][m2._5_1_]->field_0x60 >> 9 & 1) == 0)))) {
      return (monst *)0x0;
    }
  }
  else {
    if ((((m2._7_1_ < '\x01') || ('O' < m2._7_1_)) || (m2._6_1_ < '\0')) || ('\x14' < m2._6_1_)) {
      return (monst *)0x0;
    }
    m2._4_1_ = m2._7_1_;
    m2._5_1_ = m2._6_1_;
    if (((level->monsters[m2._7_1_][m2._6_1_] != (monst *)0x0) &&
        ((*(uint *)&level->monsters[m2._7_1_][m2._6_1_]->field_0x60 >> 9 & 1) == 0)) &&
       ((bVar3 = enexto((coord *)((long)&m2 + 4),level,m2._7_1_,m2._6_1_,pmStack_18->data),
        bVar3 == '\0' ||
        ((level->monsters[m2._4_1_][m2._5_1_] != (monst *)0x0 &&
         ((*(uint *)&level->monsters[m2._4_1_][m2._5_1_]->field_0x60 >> 9 & 1) == 0)))))) {
      return (monst *)0x0;
    }
  }
  m3 = newmonst(0,0);
  memcpy(m3,pmStack_18,0x78);
  m3->nmon = level->monlist;
  level->monlist = m3;
  uVar2 = flags.ident + 1;
  m3->m_id = flags.ident;
  flags.ident = uVar2;
  if (m3->m_id == 0) {
    uVar2 = flags.ident + 1;
    m3->m_id = flags.ident;
    flags.ident = uVar2;
  }
  m3->mx = m2._4_1_;
  m3->my = m2._5_1_;
  m3->minvent = (obj *)0x0;
  *(uint *)&m3->field_0x60 = *(uint *)&m3->field_0x60 & 0xfeffffff;
  m3->mhpmax = pmStack_18->mhpmax;
  m3->mhp = pmStack_18->mhp / 2;
  pmStack_18->mhp = pmStack_18->mhp - m3->mhp;
  if ((*(uint *)&pmStack_18->field_0x60 >> 0x19 & 1) != 0) {
    *(uint *)&m3->field_0x60 = *(uint *)&m3->field_0x60 & 0xfdffffff;
  }
  if ((*(uint *)&pmStack_18->field_0x60 >> 0x1b & 1) != 0) {
    *(uint *)&m3->field_0x60 = *(uint *)&m3->field_0x60 & 0xf7ffffff;
  }
  if ((*(uint *)&pmStack_18->field_0x60 >> 0x1c & 1) != 0) {
    *(uint *)&m3->field_0x60 = *(uint *)&m3->field_0x60 & 0xefffffff;
  }
  m3->mxlth = 0;
  place_monster(m3,(int)m3->mx,(int)m3->my);
  if ((((m3->data->mlet != '\x19') && (m3->data != mons + 0x20)) && (m3->data != mons + 0x21)) &&
     (m3->data != mons + 0x101)) {
    pcVar5 = mons_mname(m3->data);
    iVar4 = strcmp(pcVar5,"gold dragon");
    if (iVar4 != 0) {
      pcVar5 = mons_mname(m3->data);
      iVar4 = strcmp(pcVar5,"baby gold dragon");
      if (((iVar4 != 0) && (m3->data != mons + 0x73)) && (m3->data != mons + 0xa0))
      goto LAB_00207011;
    }
  }
  lev = m3->dlevel;
  x_00 = m3->mx;
  y_00 = m3->my;
  if (((m3->data->mlet == '\x19') || (m3->data == mons + 0x20)) ||
     ((m3->data == mons + 0x21 || (m3->data == mons + 0x101)))) {
LAB_00206fbf:
    local_44 = 1;
  }
  else {
    pcVar5 = mons_mname(m3->data);
    iVar4 = strcmp(pcVar5,"gold dragon");
    if (iVar4 == 0) goto LAB_00206fbf;
    pcVar5 = mons_mname(m3->data);
    iVar4 = strcmp(pcVar5,"baby gold dragon");
    if ((iVar4 == 0) || (m3->data == mons + 0x73)) goto LAB_00206fbf;
    local_44 = (uint)(m3->data == mons + 0xa0);
  }
  new_light_source(lev,x_00,y_00,local_44,1,m3);
LAB_00207011:
  if (m3->mnamelth == '\0') {
    if ((*(uint *)&pmStack_18->field_0x60 >> 0x19 & 1) != 0) {
      pcVar5 = shkname(pmStack_18);
      m3 = christen_monst(m3,pcVar5);
    }
  }
  else {
    m3->mnamelth = '\0';
    m3 = christen_monst(m3,(char *)((long)(pmStack_18->mtrack + 0x18) + (long)(int)pmStack_18->mxlth
                                   ));
  }
  if (flags.mon_moving == '\0') {
    if (pmStack_18->mtame == '\0') {
      if ((*(uint *)&pmStack_18->field_0x60 >> 0x16 & 1) != 0) {
        if (u.uluck + 2 < 3) {
          local_5c = 2;
        }
        else {
          local_5c = u.uluck + 2;
        }
        iVar4 = rn2(local_5c);
        *(uint *)&m3->field_0x60 =
             *(uint *)&m3->field_0x60 & 0xffbfffff | (uint)(iVar4 != 0) << 0x16;
      }
    }
    else {
      if (u.uluck + 2 < 3) {
        local_54 = 2;
      }
      else {
        local_54 = u.uluck + 2;
      }
      iVar4 = rn2(local_54);
      if (iVar4 == 0) {
        sVar1 = '\0';
      }
      else {
        sVar1 = pmStack_18->mtame;
      }
      m3->mtame = sVar1;
    }
  }
  newsym((int)m3->mx,(int)m3->my);
  if (m3->mtame != '\0') {
    if ((*(uint *)&pmStack_18->field_0x60 >> 0x1a & 1) == 0) {
      m3->mtame = '\0';
      pmVar6 = tamedog(m3,(obj *)0x0);
      if (pmVar6 != (monst *)0x0) {
        memcpy(&pmVar6->field_0x74,&pmStack_18->field_0x74,0x24);
        m3 = pmVar6;
      }
    }
    else {
      pmVar6 = newmonst(1,(uint)pmStack_18->mnamelth);
      memcpy(pmVar6,m3,0x78);
      pmVar6->mxtyp = '\x01';
      pmVar6->mxlth = 6;
      if (m3->mnamelth != '\0') {
        strcpy((char *)((long)(pmVar6->mtrack + 0x18) + (long)(int)pmVar6->mxlth),
               (char *)((long)(m3->mtrack + 0x18) + (long)(int)m3->mxlth));
      }
      *(undefined4 *)&pmVar6->field_0x74 = *(undefined4 *)&pmStack_18->field_0x74;
      *(undefined2 *)&pmVar6[1].nmon = *(undefined2 *)&pmStack_18[1].nmon;
      replmon(m3,pmVar6);
      m3 = pmVar6;
    }
  }
  set_malign(m3);
  return m3;
}

Assistant:

struct monst *clone_mon(struct monst *mon,
			xchar x, xchar y)/* clone's preferred location or 0 (near mon) */
{
	coord mm;
	struct monst *m2;

	/* may be too weak or have been extinguished for population control */
	if (mon->mhp <= 1 || (mvitals[monsndx(mon->data)].mvflags & G_EXTINCT))
	    return NULL;

	if (x == 0) {
	    mm.x = mon->mx;
	    mm.y = mon->my;
	    if (!enexto(&mm, level, mm.x, mm.y, mon->data) || MON_AT(level, mm.x, mm.y))
		return NULL;
	} else if (!isok(x, y)) {
	    return NULL;	/* paranoia */
	} else {
	    mm.x = x;
	    mm.y = y;
	    if (MON_AT(level, mm.x, mm.y)) {
		if (!enexto(&mm, level, mm.x, mm.y, mon->data) || MON_AT(level, mm.x, mm.y))
		    return NULL;
	    }
	}
	m2 = newmonst(MX_NONE, 0);
	*m2 = *mon;			/* copy condition of old monster */
	m2->nmon = level->monlist;
	level->monlist = m2;
	m2->m_id = flags.ident++;
	if (!m2->m_id) m2->m_id = flags.ident++;	/* ident overflowed */
	m2->mx = mm.x;
	m2->my = mm.y;

	m2->minvent = NULL; /* objects don't clone */
	m2->mleashed = FALSE;
	/* Max HP the same, but current HP halved for both.  The caller
	 * might want to override this by halving the max HP also.
	 * When current HP is odd, the original keeps the extra point.
	 */
	m2->mhpmax = mon->mhpmax;
	m2->mhp = mon->mhp / 2;
	mon->mhp -= m2->mhp;

	/* since shopkeepers and guards will only be cloned if they've been
	 * polymorphed away from their original forms, the clone doesn't have
	 * room for the extra information.  we also don't want two shopkeepers
	 * around for the same shop.
	 */
	if (mon->isshk) m2->isshk = FALSE;
	if (mon->isgd) m2->isgd = FALSE;
	if (mon->ispriest) m2->ispriest = FALSE;
	m2->mxlth = 0;
	place_monster(m2, m2->mx, m2->my);
	if (emits_light(m2->data))
	    new_light_source(m2->dlevel, m2->mx, m2->my, emits_light(m2->data),
			     LS_MONSTER, m2);
	if (m2->mnamelth) {
	    m2->mnamelth = 0; /* or it won't get allocated */
	    m2 = christen_monst(m2, NAME(mon));
	} else if (mon->isshk) {
	    m2 = christen_monst(m2, shkname(mon));
	}

	/* not all clones caused by player are tame or peaceful */
	if (!flags.mon_moving) {
	    if (mon->mtame)
		m2->mtame = rn2(max(2 + u.uluck, 2)) ? mon->mtame : 0;
	    else if (mon->mpeaceful)
		m2->mpeaceful = rn2(max(2 + u.uluck, 2)) ? 1 : 0;
	}

	newsym(m2->mx,m2->my);	/* display the new monster */
	if (m2->mtame) {
	    struct monst *m3;

	    if (mon->isminion) {
		m3 = newmonst(MX_EPRI, mon->mnamelth);
		*m3 = *m2;
		m3->mxtyp = MX_EPRI;
		m3->mxlth = sizeof(struct epri);
		if (m2->mnamelth) strcpy(NAME(m3), NAME(m2));
		*(EPRI(m3)) = *(EPRI(mon));
		replmon(m2, m3);
		m2 = m3;
	    } else {
		/* because m2 is a copy of mon it is tame but not init'ed.
		 * however, tamedog will not re-tame a tame dog, so m2
		 * must be made non-tame to get initialized properly.
		 */
		m2->mtame = 0;
		if ((m3 = tamedog(m2, NULL)) != 0) {
		    m2 = m3;
		    *(EDOG(m2)) = *(EDOG(mon));
		}
	    }
	}
	set_malign(m2);

	return m2;
}